

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O1

int os_date(lua_State *L)

{
  char cVar1;
  int iVar2;
  char *__s1;
  tm *stm;
  uint uVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  char cc [4];
  time_t t;
  size_t slen;
  luaL_Buffer b;
  char local_47c;
  undefined1 local_47b [3];
  lua_Integer local_478;
  tm *local_470;
  char *local_468;
  char *local_460;
  size_t local_458;
  luaL_Buffer local_450;
  
  __s1 = luaL_optlstring(L,1,"%c",&local_458);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    local_478 = time((time_t *)0x0);
  }
  else {
    local_478 = luaL_checkinteger(L,2);
  }
  pcVar4 = __s1 + local_458;
  if (*__s1 == '!') {
    stm = (tm *)gmtime(&local_478);
    __s1 = __s1 + 1;
  }
  else {
    stm = (tm *)localtime(&local_478);
  }
  if (stm == (tm *)0x0) {
    iVar2 = luaL_error(L,"date result cannot be represented in this installation");
  }
  else {
    iVar2 = strcmp(__s1,"*t");
    if (iVar2 == 0) {
      lua_createtable(L,0,9);
      setallfields(L,stm);
    }
    else {
      local_47c = '%';
      luaL_buffinit(L,&local_450);
      pcVar6 = pcVar4;
      if (__s1 < pcVar4) {
        do {
          local_468 = pcVar6;
          local_470 = stm;
          if (*__s1 == '%') {
            local_460 = luaL_prepbuffsize(&local_450,0xfa);
            __s1 = __s1 + 1;
            if (0 < (long)pcVar4 - (long)__s1) {
              uVar3 = 1;
              cVar1 = 'a';
              sVar5 = 1;
              pcVar6 = 
              "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
              do {
                if (cVar1 == '|') {
                  uVar3 = uVar3 + 1;
                }
                else {
                  iVar2 = bcmp(__s1,pcVar6,sVar5);
                  if (iVar2 == 0) {
                    memcpy(local_47b,__s1,sVar5);
                    local_47b[sVar5] = 0;
                    __s1 = __s1 + sVar5;
                    goto LAB_00113154;
                  }
                }
                sVar5 = (size_t)uVar3;
                cVar1 = pcVar6[sVar5];
              } while ((cVar1 != '\0') &&
                      (pcVar6 = pcVar6 + sVar5, (long)sVar5 <= (long)pcVar4 - (long)__s1));
            }
            pcVar4 = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",__s1);
            luaL_argerror(L,1,pcVar4);
LAB_00113154:
            sVar5 = strftime(local_460,0xfa,&local_47c,(tm *)local_470);
            pcVar4 = local_468;
            local_450.n = local_450.n + sVar5;
          }
          else {
            if (local_450.size <= local_450.n) {
              luaL_prepbuffsize(&local_450,1);
            }
            cVar1 = *__s1;
            __s1 = __s1 + 1;
            local_450.b[local_450.n] = cVar1;
            local_450.n = local_450.n + 1;
          }
          stm = local_470;
          pcVar6 = local_468;
        } while (__s1 < pcVar4);
      }
      luaL_pushresult(&local_450);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int os_date (lua_State *L) {
  size_t slen;
  const char *s = luaL_optlstring(L, 1, "%c", &slen);
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  const char *se = s + slen;  /* 's' end */
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    return luaL_error(L,
                 "date result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (s < se) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s++;  /* skip '%' */
        s = checkoption(L, s, se - s, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}